

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adig.c
# Opt level: O3

ares_bool_t read_cmdline(int argc,char **argv,int start_idx)

{
  char cVar1;
  char cVar2;
  uint *puVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ares_bool_t aVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  dig_opt_cb_t *pp_Var12;
  char **str;
  int local_60;
  
  if (argc <= start_idx) {
    return ARES_TRUE;
  }
LAB_00103f80:
  pp_Var12 = &dig_options[0].cb;
  do {
    puVar3 = (uint *)pp_Var12[-1];
    if ((puVar3 == (uint *)0x0) && (*pp_Var12 == (dig_opt_cb_t)0x0)) {
      snprintf(global_config.error,0x100,"unrecognized option %s",argv[start_idx]);
      return ARES_FALSE;
    }
    cVar1 = ((anon_struct_40_6_0ff30dc8 *)(pp_Var12 + -4))->prefix;
    if ((int)cVar1 == 0) {
      pcVar11 = argv[start_idx];
LAB_00103fe0:
      iVar5 = ares_streq_max(pcVar11 + (cVar1 != '\0'),"no",2);
      pcVar11 = pcVar11 + (cVar1 != '\0') + (ulong)(iVar5 != 0) * 2;
      cVar2 = *(char *)(pp_Var12 + -2);
      if ((cVar2 == '\0') || (pcVar8 = strchr(pcVar11,(int)cVar2), pcVar8 == (char *)0x0)) {
        lVar10 = ares_strlen(pcVar11);
        pcVar8 = (char *)0x0;
      }
      else {
        lVar10 = (long)pcVar8 - (long)pcVar11;
        pcVar8 = pcVar8 + 1;
      }
      pcVar4 = (char *)pp_Var12[-3];
      if ((pcVar4 == (char *)0x0) || (iVar6 = ares_streq_max(pcVar11,pcVar4,lVar10), iVar6 != 0))
      break;
    }
    else {
      pcVar11 = argv[start_idx];
      if (cVar1 == *pcVar11) goto LAB_00103fe0;
    }
    pp_Var12 = pp_Var12 + 5;
  } while( true );
  local_60 = start_idx;
  if (*(opt_type_t *)((long)pp_Var12 + -0xc) == OPT_TYPE_BOOL) {
    if (puVar3 != (uint *)0x0) {
      *puVar3 = (uint)(iVar5 == 0);
      goto switchD_001040d6_default;
    }
    pcVar11 = "invalid use for %c%s";
    goto LAB_00104269;
  }
  if (pcVar4 == (char *)0x0) {
    pcVar8 = pcVar11;
  }
  if (cVar1 != '\0' && cVar2 == '\0') {
    if (start_idx == argc + -1) {
      pcVar11 = "insufficient arguments for %c%s";
      goto LAB_00104269;
    }
    local_60 = start_idx + 1;
    pcVar8 = argv[(long)start_idx + 1];
  }
  switch(*(opt_type_t *)((long)pp_Var12 + -0xc)) {
  case OPT_TYPE_STRING:
    if (puVar3 == (uint *)0x0) {
LAB_00104222:
      pcVar11 = "invalid use for %c%s";
      goto LAB_00104269;
    }
    if (pcVar8 != (char *)0x0) {
      if (*(void **)puVar3 != (void *)0x0) {
        free(*(void **)puVar3);
      }
      pcVar11 = strdup(pcVar8);
LAB_001041af:
      *(char **)puVar3 = pcVar11;
switchD_001040d6_default:
      start_idx = local_60 + 1;
      if (argc <= start_idx) {
        return ARES_TRUE;
      }
      goto LAB_00103f80;
    }
    break;
  case OPT_TYPE_SIZE_T:
    if (puVar3 == (uint *)0x0) goto LAB_00104222;
    if (pcVar8 != (char *)0x0) {
      iVar5 = ares_str_isnum(pcVar8);
      if (iVar5 == 0) goto LAB_00104252;
      pcVar11 = (char *)strtoul(pcVar8,(char **)0x0,10);
      goto LAB_001041af;
    }
    break;
  case OPT_TYPE_U16:
    if (puVar3 == (uint *)0x0) goto LAB_00104222;
    if (pcVar8 != (char *)0x0) {
      iVar5 = ares_str_isnum(pcVar8);
      if (iVar5 != 0) {
        uVar9 = strtoul(pcVar8,(char **)0x0,10);
        *(short *)puVar3 = (short)uVar9;
        goto switchD_001040d6_default;
      }
LAB_00104252:
      pcVar11 = "%c%s is not a numeric value";
      goto LAB_00104269;
    }
    break;
  case OPT_TYPE_FUNC:
    if (*pp_Var12 == (dig_opt_cb_t)0x0) {
      builtin_strncpy(global_config.error,"missing callback",0x11);
    }
    else {
      aVar7 = (**pp_Var12)(cVar1,pcVar4,SUB14(iVar5 == 0,0),pcVar8);
      if (aVar7 != ARES_FALSE) goto switchD_001040d6_default;
    }
    return ARES_FALSE;
  default:
    goto switchD_001040d6_default;
  }
  pcVar11 = "missing value for %c%s";
LAB_00104269:
  snprintf(global_config.error,0x100,pcVar11,(ulong)(uint)(int)cVar1,pcVar4);
  return ARES_FALSE;
}

Assistant:

static ares_bool_t read_cmdline(int argc, const char * const *argv,
                                int start_idx)
{
  int    arg;
  size_t opt;

  for (arg = start_idx; arg < argc; arg++) {
    ares_bool_t option_handled = ARES_FALSE;

    for (opt = 0; !option_handled &&
                  (dig_options[opt].opt != NULL || dig_options[opt].cb != NULL);
         opt++) {
      ares_bool_t is_true = ARES_TRUE;
      const char *value   = NULL;
      const char *nameptr = NULL;
      size_t      namelen;

      /* Match prefix character */
      if (dig_options[opt].prefix != 0 &&
          dig_options[opt].prefix != *(argv[arg])) {
        continue;
      }

      nameptr = argv[arg];

      /* skip prefix */
      if (dig_options[opt].prefix != 0) {
        nameptr++;
      }

      /* Negated option if it has a 'no' prefix */
      if (ares_streq_max(nameptr, "no", 2)) {
        is_true  = ARES_FALSE;
        nameptr += 2;
      }

      if (dig_options[opt].separator != 0) {
        const char *ptr = strchr(nameptr, dig_options[opt].separator);
        if (ptr == NULL) {
          namelen = ares_strlen(nameptr);
        } else {
          namelen = (size_t)(ptr - nameptr);
          value   = ptr + 1;
        }
      } else {
        namelen = ares_strlen(nameptr);
      }

      /* Match name */
      if (dig_options[opt].name != NULL &&
          !ares_streq_max(nameptr, dig_options[opt].name, namelen)) {
        continue;
      }

      if (dig_options[opt].name == NULL) {
        value = nameptr;
      }

      /* We need another argument for the value */
      if (dig_options[opt].type != OPT_TYPE_BOOL &&
          dig_options[opt].prefix != 0 && dig_options[opt].separator == 0) {
        if (arg == argc - 1) {
          snprintf(global_config.error, sizeof(global_config.error),
                   "insufficient arguments for %c%s", dig_options[opt].prefix,
                   dig_options[opt].name);
          return ARES_FALSE;
        }
        arg++;
        value = argv[arg];
      }

      switch (dig_options[opt].type) {
        case OPT_TYPE_BOOL:
          {
            ares_bool_t *b = dig_options[opt].opt;
            if (b == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *b = is_true;
          }
          break;
        case OPT_TYPE_STRING:
          {
            char **str = dig_options[opt].opt;
            if (str == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (*str != NULL) {
              free(*str);
            }
            *str = strdup(value);
            break;
          }
        case OPT_TYPE_SIZE_T:
          {
            size_t *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_U16:
          {
            unsigned short *s = dig_options[opt].opt;
            if (s == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "invalid use for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (value == NULL) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "missing value for %c%s", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            if (!ares_str_isnum(value)) {
              snprintf(global_config.error, sizeof(global_config.error),
                       "%c%s is not a numeric value", dig_options[opt].prefix,
                       dig_options[opt].name);
              return ARES_FALSE;
            }
            *s = (unsigned short)strtoul(value, NULL, 10);
            break;
          }
        case OPT_TYPE_FUNC:
          if (dig_options[opt].cb == NULL) {
            snprintf(global_config.error, sizeof(global_config.error),
                     "missing callback");
            return ARES_FALSE;
          }
          if (!dig_options[opt].cb(dig_options[opt].prefix,
                                   dig_options[opt].name, is_true, value)) {
            return ARES_FALSE;
          }
          break;
      }
      option_handled = ARES_TRUE;
    }

    if (!option_handled) {
      snprintf(global_config.error, sizeof(global_config.error),
               "unrecognized option %s", argv[arg]);
      return ARES_FALSE;
    }
  }

  return ARES_TRUE;
}